

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O2

bool __thiscall
stream::inno_lzma1_decompressor_impl::filter
          (inno_lzma1_decompressor_impl *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  lzma_stream *plVar6;
  lzma_error *this_00;
  allocator<char> local_c1;
  string local_c0;
  lzma_options_lzma options;
  
  if ((this->super_lzma_decompressor_impl_base).stream == (void *)0x0) {
    while (sVar4 = this->nread, sVar4 != 5) {
      pcVar3 = *begin_in;
      if (pcVar3 == end_in) {
        return true;
      }
      *begin_in = pcVar3 + 1;
      cVar1 = *pcVar3;
      this->nread = sVar4 + 1;
      this->header[sVar4] = cVar1;
    }
    bVar2 = this->header[0];
    if (0xe1 < bVar2) {
      this_00 = (lzma_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"inno lzma1 property error",&local_c1);
      lzma_error::lzma_error(this_00,&local_c0,7);
      __cxa_throw(this_00,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    options.pb = (uint32_t)(bVar2 / 0x2d);
    options.lp = (uint32_t)(byte)((ushort)((ushort)bVar2 % 0x2d) / 9);
    options.lc = (uint32_t)(bVar2 % 9);
    options.dict_size = *(uint32_t *)(this->header + 1);
    plVar6 = init_raw_lzma_stream(0x4000000000000001,&options);
    (this->super_lzma_decompressor_impl_base).stream = plVar6;
  }
  bVar5 = lzma_decompressor_impl_base::filter
                    (&this->super_lzma_decompressor_impl_base,begin_in,end_in,begin_out,end_out,
                     flush);
  return bVar5;
}

Assistant:

bool inno_lzma1_decompressor_impl::filter(const char * & begin_in, const char * end_in,
                                          char * & begin_out, char * end_out, bool flush) {
	
	// Decode the header.
	if(!stream) {
		
		// Read enough bytes to decode the header.
		while(nread != 5) {
			if(begin_in == end_in) {
				return true;
			}
			header[nread++] = *begin_in++;
		}
		
		lzma_options_lzma options;
		
		boost::uint8_t properties = boost::uint8_t(header[0]);
		if(properties > (9 * 5 * 5)) {
			throw lzma_error("inno lzma1 property error", LZMA_FORMAT_ERROR);
		}
		options.pb = boost::uint32_t(properties / (9 * 5));
		options.lp = boost::uint32_t((properties % (9 * 5)) / 9);
		options.lc = boost::uint32_t(properties % 9);
		
		options.dict_size = util::little_endian::load<boost::uint32_t>(header + 1);
		
		stream = init_raw_lzma_stream(LZMA_FILTER_LZMA1, options);
	}
	
	return lzma_decompressor_impl_base::filter(begin_in, end_in, begin_out, end_out, flush);
}